

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::mergeL(PtexSeparableKernel *this,BorderMode mode)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  float fVar5;
  
  iVar1 = this->u;
  lVar3 = (long)iVar1;
  pfVar2 = this->ku;
  if (mode != m_black) {
    if (iVar1 == 0) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = 0.0;
      lVar4 = 0;
      do {
        fVar5 = fVar5 + *(float *)((long)pfVar2 + lVar4);
        lVar4 = lVar4 + 4;
      } while (-lVar4 != lVar3 * 4);
    }
    pfVar2[-lVar3] = fVar5 + pfVar2[-lVar3];
  }
  this->ku = pfVar2 + -lVar3;
  this->uw = this->uw + iVar1;
  this->u = 0;
  return;
}

Assistant:

void mergeL(BorderMode mode)
    {
        int w = -u;
        if (mode != m_black)
            ku[w] += accumulate(ku, w);
        ku += w;
        uw -= w;
        u = 0;
    }